

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddReferencedPropertyIdMap
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  uint uVar1;
  PropertyId PVar2;
  uint32 uVar3;
  uint local_34;
  PropertyId propertyId;
  uint i;
  uint32 size;
  uint count;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  uVar1 = FunctionBody::GetReferencedPropertyIdCount(function);
  if (uVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    propertyId = 0;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      PVar2 = FunctionBody::GetReferencedPropertyIdWithMapIndex(function,local_34);
      PVar2 = encodeNonBuiltinPropertyId(this,PVar2);
      uVar3 = PrependInt32(this,builder,L"ReferencedPropertyId",PVar2,(BufferBuilderInt32 **)0x0);
      propertyId = uVar3 + propertyId;
    }
    this_local._4_4_ = propertyId;
  }
  return this_local._4_4_;
}

Assistant:

uint32 AddReferencedPropertyIdMap(BufferBuilderList & builder, FunctionBody * function)
    {
        uint count = function->GetReferencedPropertyIdCount();
        if (count == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Referenced-PropertyId map"), magicStartOfReferencedPropIdMap);
#endif

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = encodeNonBuiltinPropertyId(function->GetReferencedPropertyIdWithMapIndex(i));
            size += PrependInt32(builder, _u("ReferencedPropertyId"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Referenced-PropertyId map"), magicEndOfReferencedPropIdMap);
#endif

        return size;
    }